

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall testing::internal::ExpectationBase::CheckActionCountIfNotDone(ExpectationBase *this)

{
  size_type sVar1;
  Cardinality *pCVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *local_1f0;
  ostream *local_1e8;
  string local_1d8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream aoStack_1a8 [379];
  byte local_2d;
  int local_2c;
  int iStack_28;
  bool too_many;
  int lower_bound;
  int upper_bound;
  int action_count;
  MutexLock l;
  bool should_check;
  ExpectationBase *this_local;
  
  l.mutex_._7_1_ = 0;
  GTestMutexLock::GTestMutexLock((GTestMutexLock *)&upper_bound,&(this->mutex_).super_MutexBase);
  if ((this->action_count_checked_ & 1U) == 0) {
    this->action_count_checked_ = true;
    l.mutex_._7_1_ = 1;
  }
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)&upper_bound);
  if (((l.mutex_._7_1_ & 1) != 0) && ((this->cardinality_specified_ & 1U) != 0)) {
    sVar1 = std::vector<const_void_*,_std::allocator<const_void_*>_>::size(&this->untyped_actions_);
    lower_bound = (int)sVar1;
    pCVar2 = cardinality(this);
    iStack_28 = Cardinality::ConservativeUpperBound(pCVar2);
    pCVar2 = cardinality(this);
    local_2c = Cardinality::ConservativeLowerBound(pCVar2);
    if ((iStack_28 < lower_bound) ||
       ((lower_bound == iStack_28 && ((this->repeated_action_specified_ & 1U) != 0)))) {
      local_2d = 1;
    }
    else {
      if (lower_bound < 1) {
        return;
      }
      if (local_2c <= lower_bound) {
        return;
      }
      if ((this->repeated_action_specified_ & 1U) != 0) {
        return;
      }
      local_2d = 0;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_1e8 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1b8) {
      local_1e8 = aoStack_1a8;
    }
    DescribeLocationTo(this,local_1e8);
    poVar3 = std::operator<<(aoStack_1a8,"Too ");
    pcVar4 = "few";
    if ((local_2d & 1) != 0) {
      pcVar4 = "many";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," actions specified in ");
    pcVar4 = source_text(this);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"...\n");
    std::operator<<(poVar3,"Expected to be ");
    pCVar2 = cardinality(this);
    local_1f0 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1b8) {
      local_1f0 = aoStack_1a8;
    }
    Cardinality::DescribeTo(pCVar2,local_1f0);
    poVar3 = std::operator<<(aoStack_1a8,", but has ");
    pcVar4 = "only ";
    if ((local_2d & 1) != 0) {
      pcVar4 = "";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,lower_bound);
    poVar3 = std::operator<<(poVar3," WillOnce()");
    pcVar4 = "s";
    if (lower_bound == 1) {
      pcVar4 = "";
    }
    std::operator<<(poVar3,pcVar4);
    if ((this->repeated_action_specified_ & 1U) != 0) {
      std::operator<<(aoStack_1a8," and a WillRepeatedly()");
    }
    std::operator<<(aoStack_1a8,".");
    std::__cxx11::stringstream::str();
    Log(kWarning,&local_1d8,-1);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  bool should_check = false;
  {
    MutexLock l(&mutex_);
    if (!action_count_checked_) {
      action_count_checked_ = true;
      should_check = true;
    }
  }

  if (should_check) {
    if (!cardinality_specified_) {
      // The cardinality was inferred - no need to check the action
      // count against it.
      return;
    }

    // The cardinality was explicitly specified.
    const int action_count = static_cast<int>(untyped_actions_.size());
    const int upper_bound = cardinality().ConservativeUpperBound();
    const int lower_bound = cardinality().ConservativeLowerBound();
    bool too_many;  // True if there are too many actions, or false
    // if there are too few.
    if (action_count > upper_bound ||
        (action_count == upper_bound && repeated_action_specified_)) {
      too_many = true;
    } else if (0 < action_count && action_count < lower_bound &&
               !repeated_action_specified_) {
      too_many = false;
    } else {
      return;
    }

    ::std::stringstream ss;
    DescribeLocationTo(&ss);
    ss << "Too " << (too_many ? "many" : "few") << " actions specified in "
       << source_text() << "...\n"
       << "Expected to be ";
    cardinality().DescribeTo(&ss);
    ss << ", but has " << (too_many ? "" : "only ") << action_count
       << " WillOnce()" << (action_count == 1 ? "" : "s");
    if (repeated_action_specified_) {
      ss << " and a WillRepeatedly()";
    }
    ss << ".";
    Log(kWarning, ss.str(), -1);  // -1 means "don't print stack trace".
  }
}